

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_custom_border_color
          (Impl *this,Value *state,VkSamplerCustomBorderColorCreateInfoEXT **out_info)

{
  uint uVar1;
  VkFormat VVar2;
  VkSamplerCustomBorderColorCreateInfoEXT *pVVar3;
  Type pGVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint local_2c;
  uint32_t i;
  VkSamplerCustomBorderColorCreateInfoEXT *info;
  VkSamplerCustomBorderColorCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkSamplerCustomBorderColorCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar3;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"customBorderColor");
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator[](pGVar4,local_2c);
    uVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(this_00);
    *(uint *)((long)&pVVar3->customBorderColor + (ulong)local_2c * 4) = uVar1;
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"format");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->format = VVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sampler_custom_border_color(const Value &state,
							    VkSamplerCustomBorderColorCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerCustomBorderColorCreateInfoEXT>();
	*out_info = info;

	for (uint32_t i = 0; i < 4; i++)
		info->customBorderColor.uint32[i] = state["customBorderColor"][i].GetUint();
	info->format = static_cast<VkFormat>(state["format"].GetUint());

	return true;
}